

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-linux.c
# Opt level: O0

char * windows_product_name(void)

{
  int iVar1;
  GPtrArray *pGVar2;
  GPtrArray *search_result;
  GError *error;
  char *pcStack_28;
  int exit_code;
  char *result;
  char *cmd_err;
  char *cmd_out;
  char *cmd;
  
  cmd_out = "reg.exe query \"HKLM\\software\\microsoft\\windows nt\\currentversion\" /v ProductName"
  ;
  cmd_err = (char *)0x0;
  result = (char *)0x0;
  pcStack_28 = (char *)0x0;
  search_result = (GPtrArray *)0x0;
  iVar1 = g_spawn_command_line_sync
                    ("reg.exe query \"HKLM\\software\\microsoft\\windows nt\\currentversion\" /v ProductName"
                     ,&cmd_err,&result,(long)&error + 4,&search_result);
  if (iVar1 == 0) {
    g_log("rifiuti2",0x80,"Error running reg.exe: %s",*(undefined8 *)&search_result->len);
  }
  else if (error._4_4_ == 0) {
    g_log("rifiuti2",0x80,"reg.exe output: %s",cmd_err);
    pGVar2 = _search_delimited_text(cmd_err,"ProductName","    ",1,3);
    if (pGVar2->len != 1) {
      g_assertion_message_expr
                ("rifiuti2",
                 "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/utils-linux.c"
                 ,0xe4,"windows_product_name","search_result->len == 1");
    }
    pcStack_28 = (char *)g_strdup(*pGVar2->pdata);
    g_ptr_array_free(pGVar2,1);
  }
  else {
    g_log("rifiuti2",0x80,"reg.exe error: %s",result);
  }
  g_free(cmd_err);
  g_free(result);
  g_clear_error(&search_result);
  return pcStack_28;
}

Assistant:

char *
windows_product_name (void)
{
    const char *cmd = "reg.exe query \"HKLM\\software\\microsoft\\windows nt\\currentversion\" /v ProductName";
    char *cmd_out = NULL, *cmd_err = NULL, *result = NULL;
    int exit_code;
    GError *error = NULL;
    GPtrArray *search_result;

    if (FALSE == g_spawn_command_line_sync(
            cmd, &cmd_out, &cmd_err, &exit_code, &error))
    {
        g_debug ("Error running reg.exe: %s", error->message);
        goto prod_cleanup;
    }

    if (exit_code != 0)
    {
        g_debug ("reg.exe error: %s", cmd_err);
        goto prod_cleanup;
    }

    g_debug ("reg.exe output: %s", cmd_out);

    search_result = _search_delimited_text (
        (const char *)cmd_out, "ProductName", "    ", 1, 3);
    g_assert (search_result->len == 1);
    result = g_strdup ((char *) (search_result->pdata[0]));
    g_ptr_array_free (search_result, TRUE);

    prod_cleanup:

    g_free (cmd_out);
    g_free (cmd_err);
    g_clear_error (&error);
    return result;
}